

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_base.hpp
# Opt level: O1

void boost::detail::function::
     functor_manager<boost::algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>_>_>
     ::manage(function_buffer *in_buffer,function_buffer *out_buffer,
             functor_manager_operation_type op)

{
  ulong __n;
  undefined8 *puVar1;
  int iVar2;
  undefined8 *puVar3;
  undefined8 *__dest;
  undefined8 *__src;
  char *__s1;
  
  if (op == get_functor_type_tag) {
    *(pointer_____offset_0x10___ **)out_buffer =
         &algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>>::typeinfo;
    *(char *)((long)out_buffer + 8) = '\0';
    *(char *)((long)out_buffer + 9) = '\0';
    return;
  }
  switch(op) {
  case clone_functor_tag:
    puVar1 = *(undefined8 **)in_buffer;
    puVar3 = (undefined8 *)operator_new(0x20);
    __n = puVar1[2];
    puVar3[2] = __n;
    *puVar3 = 0;
    __src = puVar1;
    __dest = puVar3;
    if (0x10 < __n) {
      __dest = (undefined8 *)operator_new__(__n);
      *puVar3 = __dest;
      __src = (undefined8 *)*puVar1;
    }
    memcpy(__dest,__src,__n);
    *(undefined4 *)(puVar3 + 3) = *(undefined4 *)(puVar1 + 3);
    *(undefined8 **)out_buffer = puVar3;
    break;
  case move_functor_tag:
    *(undefined8 *)out_buffer = *(undefined8 *)in_buffer;
    *(undefined8 *)in_buffer = 0;
    break;
  case destroy_functor_tag:
    puVar1 = *(undefined8 **)out_buffer;
    if (puVar1 != (undefined8 *)0x0) {
      if ((0x10 < (ulong)puVar1[2]) && ((void *)*puVar1 != (void *)0x0)) {
        operator_delete__((void *)*puVar1);
      }
      operator_delete(puVar1);
    }
    goto LAB_00167c47;
  case check_functor_type_tag:
    __s1 = *(char **)(*(long *)out_buffer + 8) + (**(char **)(*(long *)out_buffer + 8) == '*');
    if ((__s1 == "N5boost9algorithm6detail13token_finderFINS1_10is_any_ofFIcEEEE") ||
       (iVar2 = strcmp(__s1,"N5boost9algorithm6detail13token_finderFINS1_10is_any_ofFIcEEEE"),
       iVar2 == 0)) {
      *(undefined8 *)out_buffer = *(undefined8 *)in_buffer;
      return;
    }
LAB_00167c47:
    *(undefined8 *)out_buffer = 0;
    break;
  default:
    *(pointer_____offset_0x10___ **)out_buffer =
         &algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>>::typeinfo;
    *(char *)((long)out_buffer + 8) = '\0';
    *(char *)((long)out_buffer + 9) = '\0';
  }
  return;
}

Assistant:

static inline void
        manage(const function_buffer& in_buffer, function_buffer& out_buffer,
               functor_manager_operation_type op)
        {
          typedef typename get_function_tag<functor_type>::type tag_type;
          switch (op) {
          case get_functor_type_tag:
            out_buffer.members.type.type = &boost::typeindex::type_id<functor_type>().type_info();
            out_buffer.members.type.const_qualified = false;
            out_buffer.members.type.volatile_qualified = false;
            return;

          default:
            manager(in_buffer, out_buffer, op, tag_type());
            return;
          }
        }